

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparableString.hpp
# Opt level: O2

string * __thiscall
database::ComparableString::_ToLowerCase
          (string *__return_storage_ptr__,ComparableString *this,string *string)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  size_type sVar4;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)string);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar2 = __return_storage_ptr__->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    iVar3 = tolower((int)pcVar1[sVar4]);
    pcVar1[sVar4] = (char)iVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string _ToLowerCase(const std::string& string) const
    {
      std::string _string = string;
      std::transform(_string.begin(),_string.end(),_string.begin(),::tolower);
      return _string;
    }